

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  pointer pcVar1;
  ulong uVar2;
  short *psVar3;
  bool bVar4;
  int iVar5;
  Edition minimum_edition;
  Edition maximum_edition;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  CommandLineInterface *this_00;
  char *in_R9;
  string_view str;
  string_view plugin_prefix;
  string_view directive;
  string parameters;
  string parameters_1;
  string error;
  string local_b8;
  string local_98;
  string local_78;
  LogMessage local_58;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    uVar2 = (output_directive->name)._M_string_length;
    bVar4 = true;
    if ((1 < uVar2) &&
       (psVar3 = (short *)(output_directive->name)._M_dataplus._M_p, 3 < uVar2 && *psVar3 == 0x2d2d)
       ) {
      bVar4 = *(int *)((long)psVar3 + (uVar2 - 4)) != 0x74756f5f;
    }
    if (bVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0xa5d,
                 "absl::StartsWith(output_directive.name, \"--\") && absl::EndsWith(output_directive.name, \"_out\")"
                );
      str._M_str = "Bad name for plugin generator: ";
      str._M_len = 0x1f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_58,str);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_58,&output_directive->name);
      if (bVar4) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
    }
    plugin_prefix._M_str = (char *)(output_directive->name)._M_string_length;
    plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
    directive._M_str = in_R9;
    directive._M_len = (size_t)(output_directive->name)._M_dataplus._M_p;
    compiler::(anonymous_namespace)::PluginName_abi_cxx11_
              (&local_b8,(_anonymous_namespace_ *)(this->plugin_prefix_)._M_string_length,
               plugin_prefix,directive);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>(&local_48,&this->plugin_parameters_,&local_b8);
    if (*(long *)((long)local_48.first.field_1.slot_ + 0x28) != 0) {
      if (local_98._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_98);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::try_emplace_impl<std::__cxx11::string_const&>(&local_48,&this->plugin_parameters_,&local_b8)
      ;
      std::__cxx11::string::_M_append
                ((char *)&local_98,*(ulong *)((long)local_48.first.field_1.slot_ + 0x20));
    }
    bVar4 = GeneratePluginOutput(this,parsed_files,&local_b8,&local_98,generator_context,&local_78);
    if (bVar4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
LAB_001d606d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                          (output_directive->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_001d61b6;
    }
    bVar4 = true;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    pcVar1 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar1,pcVar1 + (output_directive->parameter)._M_string_length);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_98,&this->generator_parameters_,&output_directive->name);
    if (*(long *)(local_98._M_string_length + 0x28) != 0) {
      if (local_b8._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_b8);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::try_emplace_impl<std::__cxx11::string_const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_98,&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append
                ((char *)&local_b8,*(ulong *)(local_98._M_string_length + 0x20));
    }
    this_00 = (CommandLineInterface *)output_directive->generator;
    iVar5 = (**(_func_int **)((long)(this_00->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar4 = EnforceProto3OptionalSupport
                      (this_00,&output_directive->name,CONCAT44(extraout_var,iVar5),parsed_files);
    if (bVar4) {
      iVar5 = (*output_directive->generator->_vptr_CodeGenerator[4])();
      minimum_edition = (*output_directive->generator->_vptr_CodeGenerator[7])();
      maximum_edition = (*output_directive->generator->_vptr_CodeGenerator[8])();
      bVar4 = EnforceEditionsSupport
                        (this,&output_directive->name,CONCAT44(extraout_var_00,iVar5),
                         minimum_edition,maximum_edition,parsed_files);
      if (bVar4) {
        iVar5 = (*output_directive->generator->_vptr_CodeGenerator[3])
                          (output_directive->generator,parsed_files,&local_b8,generator_context,
                           &local_78);
        if ((char)iVar5 != '\0') goto LAB_001d606d;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                            (output_directive->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
LAB_001d61b6:
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == nullptr) {
    // This is a plugin.
    ABSL_CHECK(absl::StartsWith(output_directive.name, "--") &&
               absl::EndsWith(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!EnforceEditionsSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(),
            output_directive.generator->GetMinimumEdition(),
            output_directive.generator->GetMaximumEdition(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}